

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

statement_ptr __thiscall
mjs::parser::
make_statement<mjs::function_definition,mjs::source_extend&,std::__cxx11::wstring&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
          (parser *this,source_extend *args,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args_1,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *args_2,unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *args_3)

{
  long lVar1;
  function_definition *this_00;
  statement_ptr *in_R9;
  source_extend local_58;
  undefined1 local_39;
  statement_ptr *local_38;
  unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *args_local_3;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *args_local_2;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args_local_1;
  source_extend *args_local;
  parser *this_local;
  statement_ptr *s;
  
  lVar1._0_4_ = args[4].start;
  lVar1._4_4_ = args[4].end;
  args_local_3 = args_3;
  args_local_2 = args_2;
  args_local_1 = args_1;
  args_local = args;
  this_local = this;
  if (lVar1 == 0) {
    __assert_fail("statement_pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                  ,0x147,
                  "statement_ptr mjs::parser::make_statement(Args &&...) [T = mjs::function_definition, Args = <mjs::source_extend &, std::basic_string<wchar_t> &, std::vector<std::basic_string<wchar_t>>, std::unique_ptr<mjs::statement>>]"
                 );
  }
  local_39 = 0;
  local_38 = in_R9;
  this_00 = (function_definition *)operator_new(0x80);
  position_stack_node::extend(&local_58,*(position_stack_node **)&args[4].start);
  function_definition::function_definition
            (this_00,&local_58,(source_extend *)args_local_1,(wstring *)args_local_2,
             (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)args_local_3,local_38);
  std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>::
  unique_ptr<std::default_delete<mjs::statement>,void>
            ((unique_ptr<mjs::statement,std::default_delete<mjs::statement>> *)this,(pointer)this_00
            );
  source_extend::~source_extend(&local_58);
  return (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)
         (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)this;
}

Assistant:

statement_ptr make_statement(Args&&... args) {
        assert(statement_pos_);
        auto s = statement_ptr{new T{statement_pos_->extend(), std::forward<Args>(args)...}};
#ifdef PARSER_DEBUG
        std::wcout << s->extend() << " Producting: " << *s << "\n";
#endif
        return s;
    }